

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalNinjaGenerator::AddRule
          (cmGlobalNinjaGenerator *this,string *name,string *command,string *description,
          string *comment,string *depfile,string *deptype,string *rspfile,string *rspcontent,
          string *restat,bool generator)

{
  bool bVar1;
  mapped_type_conflict mVar2;
  mapped_type_conflict *pmVar3;
  bool generator_local;
  string *depfile_local;
  string *comment_local;
  string *description_local;
  string *command_local;
  string *name_local;
  cmGlobalNinjaGenerator *this_local;
  
  bVar1 = HasRule(this,name);
  if (!bVar1) {
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&this->Rules,name);
    WriteRule((ostream *)this->RulesFileStream,name,command,description,comment,depfile,deptype,
              rspfile,rspcontent,restat,generator);
    mVar2 = std::__cxx11::string::size();
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->RuleCmdLength,name);
    *pmVar3 = mVar2;
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AddRule(const std::string& name,
                                     const std::string& command,
                                     const std::string& description,
                                     const std::string& comment,
                                     const std::string& depfile,
                                     const std::string& deptype,
                                     const std::string& rspfile,
                                     const std::string& rspcontent,
                                     const std::string& restat,
                                     bool generator)
{
  // Do not add the same rule twice.
  if (this->HasRule(name))
    {
    return;
    }

  this->Rules.insert(name);
  cmGlobalNinjaGenerator::WriteRule(*this->RulesFileStream,
                                    name,
                                    command,
                                    description,
                                    comment,
                                    depfile,
                                    deptype,
                                    rspfile,
                                    rspcontent,
                                    restat,
                                    generator);

  this->RuleCmdLength[name] = (int) command.size();
}